

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Geometry.cpp
# Opt level: O0

void __thiscall amrex::Geometry::GetVolume(Geometry *this,MultiFab *vol)

{
  bool bVar1;
  FabArrayBase *in_RSI;
  CoordSys *in_RDI;
  GpuArray<double,_3U> a_dx;
  IntVect *in_stack_00000090;
  int in_stack_00000098;
  int in_stack_0000009c;
  value_type in_stack_000000a0;
  FabArray<amrex::FArrayBox> *in_stack_000000a8;
  char *in_stack_ffffffffffffff80;
  GpuArray<double,_3U> local_60;
  FabArrayBase *local_48;
  undefined4 local_34;
  GpuArray<double,_3U> *local_30;
  undefined4 local_24;
  GpuArray<double,_3U> *local_20;
  undefined4 local_14;
  GpuArray<double,_3U> *local_10;
  char *local_8;
  
  local_48 = in_RSI;
  CoordSys::CellSizeArray(&local_60,in_RDI);
  bVar1 = CoordSys::IsCartesian(in_RDI);
  if (bVar1) {
    local_30 = &local_60;
    local_14 = 0;
    local_24 = 1;
    local_34 = 2;
    local_20 = local_30;
    local_10 = local_30;
    FabArrayBase::nGrowVect(local_48);
    FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              (in_stack_000000a8,in_stack_000000a0,in_stack_0000009c,in_stack_00000098,
               in_stack_00000090);
  }
  else {
    local_8 = "Geometry::GetVolume: for 3d, only Cartesian is supported";
    Abort_host(in_stack_ffffffffffffff80);
  }
  return;
}

Assistant:

void
Geometry::GetVolume (MultiFab& vol) const
{
    const auto a_dx = CellSizeArray();
    if (IsCartesian()) {
        vol.setVal(AMREX_D_TERM(a_dx[0],*a_dx[1],*a_dx[2]), 0, 1, vol.nGrowVect());
    } else {
#if (AMREX_SPACEDIM == 3)
        amrex::Abort("Geometry::GetVolume: for 3d, only Cartesian is supported");
#else
#ifdef AMREX_USE_GPU
        if (Gpu::inLaunchRegion()) {
            GpuArray<Real,AMREX_SPACEDIM> a_offset{{AMREX_D_DECL(offset[0],offset[1],offset[2])}};
            int coord = (int) c_sys;
            auto const& ma = vol.arrays();
            ParallelFor(vol, vol.nGrowVect(),
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
            {
                amrex_setvol(makeSingleCellBox(i,j,k), ma[box_no], a_offset, a_dx, coord);
            });
            Gpu::streamSynchronize();
        } else
#endif
        {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(vol,TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
                CoordSys::SetVolume(vol[mfi], mfi.growntilebox());
            }
        }
#endif
    }
}